

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_move_to_usp(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 *ppTVar1;
  
  if ((((s->base).tb)->flags & 0x2000) == 0) {
    gen_exception(s,(s->base).pc_next,8);
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  ppTVar1 = s->writeback;
  if (((uint)s->writeback_mask >> (insn & 7) & 1) == 0) {
    ppTVar1 = tcg_ctx->cpu_aregs;
  }
  tcg_gen_op3_m68k(tcg_ctx,INDEX_op_st_i32,(TCGArg)(ppTVar1[insn & 7] + (long)tcg_ctx),
                   (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0x50);
  return;
}

Assistant:

DISAS_INSN(move_to_usp)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (IS_USER(s)) {
        gen_exception(s, s->base.pc_next, EXCP_PRIVILEGE);
        return;
    }
    tcg_gen_st_i32(tcg_ctx, AREG(insn, 0), tcg_ctx->cpu_env,
                   offsetof(CPUM68KState, sp[M68K_USP]));
}